

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_TestUnpackWithTypeMismatch_Test::
~AnyTest_TestUnpackWithTypeMismatch_Test(AnyTest_TestUnpackWithTypeMismatch_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnyTest, TestUnpackWithTypeMismatch) {
  proto2_unittest::TestAny payload;
  payload.set_int32_value(13);
  google::protobuf::Any any;
  any.PackFrom(payload);

  // Attempt to unpack into the wrong type.
  proto2_unittest::TestAllTypes dest;
  EXPECT_FALSE(any.UnpackTo(&dest));
}